

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_lex.c
# Opt level: O1

void easm_push_buffer_state(YY_BUFFER_STATE new_buffer,yyscan_t yyscanner)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  yyguts_t *yyg_1;
  yyguts_t *yyg;
  
  if (new_buffer != (YY_BUFFER_STATE)0x0) {
    easm_ensure_buffer_stack(yyscanner);
    if ((*(long *)((long)yyscanner + 0x38) != 0) &&
       (*(long *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8) != 0))
    {
      **(undefined1 **)((long)yyscanner + 0x50) = *(undefined1 *)((long)yyscanner + 0x40);
      lVar1 = *(long *)((long)yyscanner + 0x28);
      lVar2 = *(long *)((long)yyscanner + 0x38);
      *(undefined8 *)(*(long *)(lVar2 + lVar1 * 8) + 0x10) = *(undefined8 *)((long)yyscanner + 0x50)
      ;
      *(undefined4 *)(*(long *)(lVar2 + lVar1 * 8) + 0x1c) = *(undefined4 *)((long)yyscanner + 0x44)
      ;
    }
    lVar1 = *(long *)((long)yyscanner + 0x38);
    if ((lVar1 != 0) && (*(long *)(lVar1 + *(long *)((long)yyscanner + 0x28) * 8) != 0)) {
      *(long *)((long)yyscanner + 0x28) = *(long *)((long)yyscanner + 0x28) + 1;
    }
    lVar2 = *(long *)((long)yyscanner + 0x28);
    *(YY_BUFFER_STATE *)(lVar1 + lVar2 * 8) = new_buffer;
    lVar1 = *(long *)(*(long *)((long)yyscanner + 0x38) + lVar2 * 8);
    *(undefined4 *)((long)yyscanner + 0x44) = *(undefined4 *)(lVar1 + 0x1c);
    puVar3 = *(undefined1 **)(lVar1 + 0x10);
    *(undefined1 **)((long)yyscanner + 0x50) = puVar3;
    *(undefined1 **)((long)yyscanner + 0x90) = puVar3;
    *(undefined8 *)((long)yyscanner + 0x18) =
         **(undefined8 **)(*(long *)((long)yyscanner + 0x38) + lVar2 * 8);
    *(undefined1 *)((long)yyscanner + 0x40) = *puVar3;
    *(undefined4 *)((long)yyscanner + 0x60) = 1;
  }
  return;
}

Assistant:

void yypush_buffer_state (YY_BUFFER_STATE new_buffer , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if (new_buffer == NULL)
		return;

	yyensure_buffer_stack(yyscanner);

	/* This block is copied from yy_switch_to_buffer. */
	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*yyg->yy_c_buf_p = yyg->yy_hold_char;
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = yyg->yy_c_buf_p;
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	/* Only push if top exists. Otherwise, replace top. */
	if (YY_CURRENT_BUFFER)
		yyg->yy_buffer_stack_top++;
	YY_CURRENT_BUFFER_LVALUE = new_buffer;

	/* copied from yy_switch_to_buffer. */
	yy_load_buffer_state( yyscanner );
	yyg->yy_did_buffer_switch_on_eof = 1;
}